

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_log(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  undefined1 auVar1 [16];
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 __x;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  double d;
  sexp in_stack_ffffffffffffffb0;
  sexp in_stack_ffffffffffffffb8;
  sexp in_stack_ffffffffffffffc0;
  sexp ctx_00;
  sexp psVar2;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  psVar2 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffb8,0,0x10);
  if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xe)) {
    local_8 = sexp_complex_log((sexp)in_RDX,(sexp)in_RCX);
  }
  else {
    if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xb)) {
      __x = (((sexp)in_RCX)->value).flonum;
    }
    else if ((in_RCX & 1) == 1) {
      auVar1._8_8_ = (long)in_RCX >> 0x3f;
      auVar1._0_8_ = in_RCX & 0xfffffffffffffffe;
      __x = (undefined8)SUB168(auVar1 / SEXT816(2),0);
    }
    else if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xd)) {
      __x = sexp_ratio_to_double((sexp)in_RDI,(sexp)in_RSI);
    }
    else {
      if (((in_RCX & 3) != 0) || (((sexp)in_RCX)->tag != 0xc)) {
        psVar2 = sexp_type_exception((sexp)in_stack_ffffffffffffffd0,psVar2,
                                     (sexp_uint_t)in_stack_ffffffffffffffc0,
                                     in_stack_ffffffffffffffb8);
        return psVar2;
      }
      __x = sexp_bignum_to_double(in_stack_ffffffffffffffc0);
    }
    if (0.0 <= (double)__x) {
      log((double)__x);
      local_8 = sexp_make_flonum(in_stack_ffffffffffffffb8,(double)in_RDI);
    }
    else {
      psVar2 = (sexp)&stack0xffffffffffffffc8;
      ctx_00 = (sexp)(((sexp)in_RDI)->value).context.saves;
      (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb8;
      sexp_make_flonum(psVar2,(double)in_stack_ffffffffffffffb0);
      sexp_make_complex(ctx_00,psVar2,in_stack_ffffffffffffffb0);
      local_8 = sexp_complex_log((sexp)in_RDX,(sexp)in_RCX);
      (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)ctx_00;
    }
  }
  return (sexp)local_8;
}

Assistant:

sexp sexp_log (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  double d;
#if SEXP_USE_COMPLEX
  sexp_gc_var1(tmp);
  if (sexp_complexp(z))
    return sexp_complex_log(ctx, z);
#endif
  if (sexp_flonump(z))
    d = sexp_flonum_value(z);
  else if (sexp_fixnump(z))
    d = (double)sexp_unbox_fixnum(z);
  maybe_convert_ratio(ctx, z)
  maybe_convert_bignum(z)
  else
    return sexp_type_exception(ctx, self, SEXP_NUMBER, z);
#if SEXP_USE_COMPLEX
  if (d < 0) {
    sexp_gc_preserve1(ctx, tmp);
    tmp = sexp_make_flonum(ctx, d);
    tmp = sexp_make_complex(ctx, tmp, SEXP_ZERO);
    tmp = sexp_complex_log(ctx, tmp);
    sexp_gc_release1(ctx);
    return tmp;
  }
#endif
  return sexp_make_flonum(ctx, log(d));
}